

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O1

bool s_eqi(string *s1,string *s2)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  bool bVar11;
  
  uVar3 = (uint)s1->_M_string_length;
  uVar8 = (uint)s2->_M_string_length;
  uVar2 = uVar8;
  if ((int)uVar3 < (int)uVar8) {
    uVar2 = uVar3;
  }
  if (0 < (int)uVar2) {
    uVar9 = 0;
    do {
      cVar1 = (s1->_M_dataplus)._M_p[uVar9];
      cVar7 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar7 = cVar1;
      }
      cVar1 = (s2->_M_dataplus)._M_p[uVar9];
      cVar10 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar10 = cVar1;
      }
      if (cVar7 != cVar10) {
        return false;
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  if ((int)uVar8 < (int)uVar3) {
    lVar6 = (long)(int)uVar3;
    if ((long)(int)uVar8 < (long)(int)uVar3) {
      lVar6 = (long)(int)uVar8;
    }
    lVar5 = 0;
    do {
      bVar11 = (s1->_M_dataplus)._M_p[lVar5 + lVar6] == ' ';
      if (!bVar11) {
        return bVar11;
      }
      iVar4 = (int)lVar5;
      lVar5 = lVar5 + 1;
    } while (~uVar2 + uVar3 != iVar4);
  }
  else {
    bVar11 = true;
    if ((int)uVar3 < (int)uVar8) {
      lVar6 = (long)(int)uVar3;
      if ((long)(int)uVar8 < (long)(int)uVar3) {
        lVar6 = (long)(int)uVar8;
      }
      lVar5 = 0;
      do {
        bVar11 = (s2->_M_dataplus)._M_p[lVar5 + lVar6] == ' ';
        if (!bVar11) {
          return bVar11;
        }
        iVar4 = (int)lVar5;
        lVar5 = lVar5 + 1;
      } while (~uVar2 + uVar8 != iVar4);
    }
  }
  return bVar11;
}

Assistant:

bool ppmb_write_test ( string file_name )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_WRITE_TEST tests the binary portable pixel map write routines.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    11 April 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, string FILE_NAME, the name of the file to contain the binary
//    portable pixel map data.
//
//    Output, bool PPMB_WRITE_TEST is true if an error occurred.
//
{
  unsigned char *b;
  bool error;
  unsigned char *g;
  int maxrgb;
  unsigned char *r;
  int xsize;
  int ysize;

  xsize = 200;
  ysize = 200;
//
//  Allocate memory.
// 
  r = new unsigned char[ xsize * ysize ];
  g = new unsigned char[ xsize * ysize ];
  b = new unsigned char[ xsize * ysize ];
//
//  Set the data.
//
  error = ppmb_example ( xsize, ysize, r, g, b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPM_EXAMPLE failed.\n";
    return true;
  }
//
//  Write the data to the file.
//
  error = ppmb_write ( file_name, xsize, ysize, r, g, b );

  delete [] r;
  delete [] g;
  delete [] b;

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPMB_WRITE failed.\n";
    return true;
  }

  return false;
}